

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionDepthReducerRecursive::VisitBoundTableRef
          (ExpressionDepthReducerRecursive *this,BoundTableRef *ref)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  iterator __end1;
  BoundJoinRef *pBVar4;
  iterator __begin1;
  pointer pCVar5;
  pointer pCVar6;
  
  if (ref->type == JOIN) {
    pBVar4 = BoundTableRef::Cast<duckdb::BoundJoinRef>(ref);
    pCVar5 = (pBVar4->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (pBVar4->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar5 != pCVar1) {
      pCVar2 = (this->correlated_columns->
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ).
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 = (this->correlated_columns->
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ).
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pCVar2 != pCVar3) {
          pCVar6 = pCVar2;
          do {
            if (((pCVar6->binding).table_index == (pCVar5->binding).table_index) &&
               ((pCVar6->binding).column_index == (pCVar5->binding).column_index)) {
              pCVar5->depth = pCVar5->depth - 1;
              break;
            }
            pCVar6 = pCVar6 + 1;
          } while (pCVar6 != pCVar3);
        }
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != pCVar1);
    }
  }
  BoundNodeVisitor::VisitBoundTableRef(&this->super_BoundNodeVisitor,ref);
  return;
}

Assistant:

void VisitBoundTableRef(BoundTableRef &ref) override {
		if (ref.type == TableReferenceType::JOIN) {
			// rewrite correlated columns in child joins
			auto &bound_join = ref.Cast<BoundJoinRef>();
			ReduceColumnDepth(bound_join.correlated_columns, correlated_columns);
		}
		// visit the children of the table ref
		BoundNodeVisitor::VisitBoundTableRef(ref);
	}